

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::shaderexecutor::
BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_2>,_vkt::shaderexecutor::Void>_>
::iterate(TestStatus *__return_storage_ptr__,
         BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_2>,_vkt::shaderexecutor::Void>_>
         *this)

{
  double *pdVar1;
  _Rb_tree_node_base *p_Var2;
  ostringstream *poVar3;
  Precision PVar4;
  Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_00;
  size_t sVar5;
  Statement *pSVar6;
  ShaderExecutor *pSVar7;
  Variable<tcu::Vector<float,_4>_> *pVVar8;
  pointer pcVar9;
  Variable<tcu::Vector<float,_2>_> *pVVar10;
  Variable<tcu::Matrix<float,_4,_2>_> *pVVar11;
  byte bVar12;
  undefined8 uVar13;
  double dVar14;
  double dVar15;
  pointer pMVar16;
  pointer pVVar17;
  bool bVar18;
  int iVar19;
  uint uVar20;
  _Rb_tree_node_base *p_Var21;
  long lVar22;
  IVal *pIVar23;
  IVal *pIVar24;
  IVal *pIVar25;
  undefined8 *puVar26;
  long lVar27;
  Vector<float,_4> *val;
  Vector<float,_2> *val_00;
  MessageBuilder *pMVar28;
  float afVar29 [2];
  float afVar30 [2];
  float afVar31 [2];
  byte bVar32;
  FloatFormat *pFVar33;
  TestStatus *pTVar34;
  byte bVar35;
  IVal in2;
  IVal reference1;
  FuncSet funcs;
  IVal in3;
  Environment env;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_2>,_vkt::shaderexecutor::Void>_>
  outputs;
  IVal reference0;
  FloatFormat highpFmt;
  void *outputArr [2];
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  inputs;
  void *inputArr [4];
  ostringstream oss;
  ResultCollector status;
  _Alloc_hider local_588;
  float fStack_584;
  size_type sStack_580;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_578;
  IVal local_559;
  double local_558;
  TestLog *local_550;
  size_t local_548;
  undefined1 local_540 [12];
  uint uStack_534;
  undefined1 auStack_530 [24];
  double dStack_518;
  double local_4e0;
  TestStatus *local_4d8;
  FloatFormat *local_4d0;
  string local_4c8;
  double local_4a8;
  long local_4a0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_498;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_2>,_vkt::shaderexecutor::Void>_>
  local_468;
  undefined1 local_438 [16];
  undefined1 local_428 [8];
  Interval IStack_420;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  *local_408;
  undefined4 local_400;
  undefined8 auStack_3d8 [2];
  ios_base local_3c8 [8];
  ios_base local_3c0 [264];
  FloatFormat local_2b8;
  pointer local_288;
  pointer local_280;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  local_278;
  pointer local_218;
  pointer local_210;
  pointer local_208;
  pointer local_200;
  undefined1 local_1f8 [112];
  undefined8 local_188 [33];
  ResultCollector local_80;
  
  bVar35 = 0;
  this_00 = this->m_samplings;
  pFVar33 = &(this->m_caseCtx).floatFormat;
  PVar4 = (this->m_caseCtx).precision;
  sVar5 = (this->m_caseCtx).numRandoms;
  local_4d8 = __return_storage_ptr__;
  iVar19 = tcu::CommandLine::getBaseSeed(((this->m_caseCtx).testContext)->m_cmdLine);
  local_4d0 = pFVar33;
  generateInputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,4>,tcu::Vector<float,2>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
            (&local_278,(shaderexecutor *)this_00,
             (Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              *)pFVar33,(FloatFormat *)(ulong)PVar4,(Precision)sVar5,(ulong)(iVar19 + 0xdeadbeef),
             (deUint32)local_588._M_p._0_4_);
  pVVar17 = local_278.in0.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  local_548 = (long)local_278.in0.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_278.in0.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_2>,_vkt::shaderexecutor::Void>_>::
  Outputs(&local_468,local_548);
  local_2b8.m_maxValue = (this->m_caseCtx).highpFormat.m_maxValue;
  local_2b8.m_minExp = (this->m_caseCtx).highpFormat.m_minExp;
  local_2b8.m_maxExp = (this->m_caseCtx).highpFormat.m_maxExp;
  local_2b8.m_fractionBits = (this->m_caseCtx).highpFormat.m_fractionBits;
  local_2b8.m_hasSubnormal = (this->m_caseCtx).highpFormat.m_hasSubnormal;
  local_2b8.m_hasInf = (this->m_caseCtx).highpFormat.m_hasInf;
  local_2b8.m_hasNaN = (this->m_caseCtx).highpFormat.m_hasNaN;
  local_2b8.m_exactPrecision = (this->m_caseCtx).highpFormat.m_exactPrecision;
  local_2b8._25_7_ = *(undefined7 *)&(this->m_caseCtx).highpFormat.field_0x19;
  local_498._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_498._M_impl.super__Rb_tree_header._M_header;
  local_498._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_498._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_498._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_498._M_impl.super__Rb_tree_header._M_header._M_right =
       local_498._M_impl.super__Rb_tree_header._M_header._M_left;
  tcu::ResultCollector::ResultCollector(&local_80);
  local_550 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  local_218 = local_278.in0.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_210 = local_278.in1.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_208 = local_278.in2.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_200 = local_278.in3.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_288 = local_468.out0.
              super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_280 = local_468.out1.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  poVar3 = (ostringstream *)(local_438 + 8);
  local_438._0_8_ = local_550;
  std::__cxx11::ostringstream::ostringstream(poVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"Statement: ",0xb);
  std::ostream::_M_insert<bool>(SUB81(poVar3,0));
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar3);
  std::ios_base::~ios_base(local_3c0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
  p_Var2 = (_Rb_tree_node_base *)(local_540 + 8);
  stack0xfffffffffffffac8 = (double)((ulong)uStack_534 << 0x20);
  auStack_530._0_4_ = 0.0;
  auStack_530._4_4_ = 0.0;
  dStack_518 = 0.0;
  pSVar6 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
  auStack_530._8_8_ = p_Var2;
  auStack_530._16_8_ = p_Var2;
  (*pSVar6->_vptr_Statement[4])(pSVar6,local_540);
  if ((_Rb_tree_node_base *)auStack_530._8_8_ != p_Var2) {
    p_Var21 = (_Rb_tree_node_base *)auStack_530._8_8_;
    do {
      (**(code **)(**(long **)(p_Var21 + 1) + 0x30))(*(long **)(p_Var21 + 1),local_1f8);
      p_Var21 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var21);
    } while (p_Var21 != p_Var2);
  }
  if (dStack_518 != 0.0) {
    poVar3 = (ostringstream *)(local_438 + 8);
    local_438._0_8_ = local_550;
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar3,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,local_588._M_p,sStack_580);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_588._M_p != &local_578) {
      operator_delete(local_588._M_p,local_578._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    std::ios_base::~ios_base(local_3c0);
  }
  std::
  _Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
               *)local_540);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f8);
  std::ios_base::~ios_base((ios_base *)local_188);
  pSVar7 = (this->m_executor).
           super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
           .m_data.ptr;
  (*pSVar7->_vptr_ShaderExecutor[2])(pSVar7,local_548,&local_218,&local_288,0);
  lVar22 = 8;
  do {
    *(undefined1 *)((long)&local_200 + lVar22) = 0;
    *(undefined8 *)(local_1f8 + lVar22) = 0x7ff0000000000000;
    *(undefined8 *)(local_1f8 + lVar22 + 8) = 0xfff0000000000000;
    lVar22 = lVar22 + 0x18;
  } while (lVar22 != 0x68);
  lVar22 = 8;
  do {
    *(undefined1 *)((long)&local_200 + lVar22) = 0;
    *(undefined8 *)(local_1f8 + lVar22) = 0x7ff0000000000000;
    *(undefined8 *)(local_1f8 + lVar22 + 8) = 0xfff0000000000000;
    lVar22 = lVar22 + 0x18;
  } while (lVar22 != 0x68);
  local_540._0_8_ = local_540._0_8_ & 0xffffffffffffff00;
  stack0xfffffffffffffac8 = INFINITY;
  auStack_530._0_4_ = 0.0;
  auStack_530._4_4_ = -NAN;
  auStack_530._8_8_ = auStack_530._8_8_ & 0xffffffffffffff00;
  auStack_530._16_8_ = (_Base_ptr)0x7ff0000000000000;
  dStack_518 = -INFINITY;
  tcu::Matrix<tcu::Interval,_4,_2>::Matrix((Matrix<tcu::Interval,_4,_2> *)local_438);
  Environment::bind<tcu::Vector<float,4>>
            ((Environment *)&local_498,
             (this->m_variables).in0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>.m_ptr,
             (IVal *)local_1f8);
  Environment::bind<tcu::Vector<float,2>>
            ((Environment *)&local_498,
             (this->m_variables).in1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.m_ptr,
             (IVal *)local_540);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_498,
             (this->m_variables).in2.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&stack0xfffffffffffffa78);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_498,
             (this->m_variables).in3.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_4c8);
  Environment::bind<tcu::Matrix<float,4,2>>
            ((Environment *)&local_498,
             (this->m_variables).out0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_2>_>_>.m_ptr,
             (IVal *)local_438);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_498,
             (this->m_variables).out1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             &local_559);
  if (local_278.in0.
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_finish == pVVar17) {
LAB_0095328e:
    poVar3 = (ostringstream *)(local_438 + 8);
    local_438._0_8_ = local_550;
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"All ",4);
    pTVar34 = local_4d8;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," inputs passed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    std::ios_base::~ios_base(local_3c0);
    local_438._0_8_ = (IVal *)local_428;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"Pass","");
    pTVar34->m_code = QP_TEST_RESULT_PASS;
    (pTVar34->m_description)._M_dataplus._M_p = (pointer)&(pTVar34->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar34->m_description,local_438._0_8_,
               (long)&((Vector<tcu::Vector<tcu::Interval,_4>,_2> *)local_438._0_8_)->m_data[0].
                      m_data[0].m_hasNaN + CONCAT44(local_438._12_4_,local_438._8_4_));
    if ((IVal *)local_438._0_8_ == (IVal *)local_428) goto LAB_00953475;
    afVar29[1] = (float)local_428._4_4_;
    afVar29[0] = (float)local_428._0_4_;
    pIVar25 = (IVal *)local_438._0_8_;
  }
  else {
    local_4a8 = (double)(local_548 + (local_548 == 0));
    local_558 = 0.0;
    local_4e0 = 0.0;
    pFVar33 = local_4d0;
    do {
      tcu::Matrix<tcu::Interval,_4,_2>::Matrix((Matrix<tcu::Interval,_4,_2> *)local_1f8);
      dVar14 = local_558;
      lVar22 = *(long *)(local_278.in0.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[(long)local_558].m_data + 2);
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doRound
                ((IVal *)local_540,pFVar33,(Vector<float,_4> *)&stack0xfffffffffffffa78);
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doConvert
                ((IVal *)local_438,pFVar33,(IVal *)local_540);
      pIVar23 = Environment::lookup<tcu::Vector<float,4>>
                          ((Environment *)&local_498,
                           (this->m_variables).in0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>
                           .m_ptr);
      pMVar28 = (MessageBuilder *)local_438;
      for (lVar27 = 0xc; lVar27 != 0; lVar27 = lVar27 + -1) {
        *(TestLog **)pIVar23->m_data = pMVar28->m_log;
        pMVar28 = (MessageBuilder *)((long)pMVar28 + (ulong)bVar35 * -0x10 + 8);
        pIVar23 = (IVal *)((long)pIVar23 + ((ulong)bVar35 * -2 + 1) * 8);
      }
      fStack_584 = local_278.in1.
                   super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[(long)local_558].m_data[1];
      local_588._M_p._0_4_ =
           local_278.in1.
           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
           _M_impl.super__Vector_impl_data._M_start[(long)local_558].m_data[0];
      ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doRound
                ((IVal *)local_540,pFVar33,(Vector<float,_2> *)&stack0xfffffffffffffa78);
      ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doConvert
                ((IVal *)local_438,pFVar33,(IVal *)local_540);
      pIVar24 = Environment::lookup<tcu::Vector<float,2>>
                          ((Environment *)&local_498,
                           (this->m_variables).in1.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>
                           .m_ptr);
      pIVar24->m_data[1].m_lo = IStack_420.m_lo;
      pIVar24->m_data[1].m_hi = (double)CONCAT44(IStack_420.m_hi._4_4_,IStack_420.m_hi._0_4_);
      pIVar24->m_data[0].m_hi = (double)CONCAT44(local_428._4_4_,local_428._0_4_);
      *(ulong *)(pIVar24->m_data + 1) = CONCAT44(IStack_420._4_4_,IStack_420._0_4_);
      *(undefined8 *)pIVar24->m_data = local_438._0_8_;
      pIVar24->m_data[0].m_lo = (double)CONCAT44(local_438._12_4_,local_438._8_4_);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_498,
                 (this->m_variables).in2.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_498,
                 (this->m_variables).in3.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      IStack_420.m_hi._0_4_ = (this->m_caseCtx).precision;
      IStack_420.m_lo = pFVar33->m_maxValue;
      local_438._0_8_ = *(undefined8 *)pFVar33;
      local_438._8_4_ = pFVar33->m_fractionBits;
      local_438._12_4_ = pFVar33->m_hasSubnormal;
      local_428._0_4_ = pFVar33->m_hasInf;
      local_428._4_4_ = pFVar33->m_hasNaN;
      IStack_420.m_hasNaN = pFVar33->m_exactPrecision;
      IStack_420._1_3_ = *(undefined3 *)&pFVar33->field_0x19;
      IStack_420._4_4_ = *(undefined4 *)&pFVar33->field_0x1c;
      local_400 = 0;
      pSVar6 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
      local_408 = &local_498;
      (*pSVar6->_vptr_Statement[3])(pSVar6,(MessageBuilder *)local_438);
      pIVar25 = Environment::lookup<tcu::Matrix<float,4,2>>
                          ((Environment *)&local_498,
                           (this->m_variables).out0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_2>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Matrix<float,_4,_2>,_tcu::Matrix<tcu::Interval,_4,_2>_>::doConvert
                ((IVal *)local_438,&local_2b8,pIVar25);
      pMVar16 = local_468.out0.
                super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      dVar15 = local_558;
      lVar27 = 0;
      do {
        *(undefined8 *)(local_1f8 + lVar27 + 0x10) = *(undefined8 *)(local_428 + lVar27);
        uVar13 = *(undefined8 *)(local_438 + lVar27 + 8);
        *(undefined8 *)(local_1f8 + lVar27) = *(undefined8 *)(local_438 + lVar27);
        *(undefined8 *)(local_1f8 + lVar27 + 8) = uVar13;
        uVar13 = *(undefined8 *)((long)auStack_3d8 + lVar27 + 8);
        *(undefined8 *)(local_1f8 + lVar27 + 0x60) = *(undefined8 *)((long)auStack_3d8 + lVar27);
        *(undefined8 *)(local_1f8 + lVar27 + 0x68) = uVar13;
        *(undefined8 *)((long)local_188 + lVar27) = *(undefined8 *)(local_3c8 + lVar27);
        lVar27 = lVar27 + 0x18;
      } while (lVar27 != 0x60);
      local_4a0 = (long)local_558 * 0x20;
      bVar32 = 1;
      pIVar23 = (IVal *)local_1f8;
      lVar27 = 0;
      do {
        bVar18 = ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doContains
                           (pIVar23,pMVar16[(long)dVar15].m_data.m_data + lVar27);
        lVar27 = 1;
        pIVar23 = (IVal *)(local_1f8 + 0x60);
        bVar12 = bVar32 & bVar18;
        bVar32 = 0;
      } while (bVar12 != 0);
      local_438._0_8_ = local_428;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_438,"Shader output 0 is outside acceptable range","");
      bVar18 = tcu::ResultCollector::check(&local_80,bVar18,(string *)local_438);
      pFVar33 = local_4d0;
      if ((TestLog *)local_438._0_8_ != (TestLog *)local_428) {
        operator_delete((void *)local_438._0_8_,CONCAT44(local_428._4_4_,local_428._0_4_) + 1);
      }
      if (!bVar18) {
        uVar20 = SUB84(local_4e0,0) + 1;
        local_4e0 = (double)(ulong)uVar20;
        poVar3 = (ostringstream *)(local_438 + 8);
        if ((int)uVar20 < 0x65) {
          local_438._0_8_ = local_550;
          std::__cxx11::ostringstream::ostringstream(poVar3);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"Failed",6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," sample:\n",9);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\t",1);
          pVVar8 = (this->m_variables).in0.
                   super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>.
                   m_ptr;
          val = (Vector<float,_4> *)auStack_530;
          pcVar9 = (pVVar8->m_name)._M_dataplus._M_p;
          local_540._0_8_ = val;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_540,pcVar9,pcVar9 + (pVVar8->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar3,(char *)local_540._0_8_,(long)stack0xfffffffffffffac8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," = ",3);
          valueToString<tcu::Vector<float,4>>
                    ((string *)&stack0xfffffffffffffa78,(shaderexecutor *)&local_2b8,
                     (FloatFormat *)
                     (local_278.in0.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + (long)dVar14),val);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar3,local_588._M_p,lVar22);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_588._M_p != &local_578) {
            operator_delete(local_588._M_p,local_578._M_allocated_capacity + 1);
          }
          if ((Vector<float,_4> *)local_540._0_8_ != (Vector<float,_4> *)auStack_530) {
            operator_delete((void *)local_540._0_8_,(ulong)(auStack_530._0_8_ + 1));
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\t",1);
          pVVar10 = (this->m_variables).in1.
                    super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.
                    m_ptr;
          val_00 = (Vector<float,_2> *)auStack_530;
          pcVar9 = (pVVar10->m_name)._M_dataplus._M_p;
          local_540._0_8_ = val_00;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_540,pcVar9,pcVar9 + (pVVar10->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar3,(char *)local_540._0_8_,(long)stack0xfffffffffffffac8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," = ",3);
          valueToString<tcu::Vector<float,2>>
                    ((string *)&stack0xfffffffffffffa78,(shaderexecutor *)&local_2b8,
                     (FloatFormat *)
                     (local_278.in1.
                      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + (long)local_558),val_00);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar3,local_588._M_p,lVar22);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_588._M_p != &local_578) {
            operator_delete(local_588._M_p,local_578._M_allocated_capacity + 1);
          }
          if ((Vector<float,_2> *)local_540._0_8_ != (Vector<float,_2> *)auStack_530) {
            operator_delete((void *)local_540._0_8_,(ulong)(auStack_530._0_8_ + 1));
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\t",1);
          pVVar11 = (this->m_variables).out0.
                    super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_2>_>_>
                    .m_ptr;
          pIVar25 = (IVal *)auStack_530;
          pcVar9 = (pVVar11->m_name)._M_dataplus._M_p;
          local_540._0_8_ = pIVar25;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_540,pcVar9,pcVar9 + (pVVar11->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar3,(char *)local_540._0_8_,(long)stack0xfffffffffffffac8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," = ",3);
          valueToString<tcu::Matrix<float,4,2>>
                    ((string *)&stack0xfffffffffffffa78,(shaderexecutor *)&local_2b8,
                     (FloatFormat *)
                     ((long)((local_468.out0.
                              super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].m_data +
                     local_4a0),(Matrix<float,_4,_2> *)pIVar25);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar3,local_588._M_p,lVar22);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar3,"\tExpected range: ",0x11);
          intervalToString<tcu::Matrix<float,4,2>>
                    (&local_4c8,(shaderexecutor *)&local_2b8,(FloatFormat *)local_1f8,pIVar25);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar3,local_4c8._M_dataplus._M_p,local_4c8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
            operator_delete(local_4c8._M_dataplus._M_p,local_4c8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_588._M_p != &local_578) {
            operator_delete(local_588._M_p,local_578._M_allocated_capacity + 1);
          }
          if ((IVal *)local_540._0_8_ != (IVal *)auStack_530) {
            operator_delete((void *)local_540._0_8_,(ulong)(auStack_530._0_8_ + 1));
          }
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar3);
          std::ios_base::~ios_base(local_3c0);
        }
      }
      local_558 = (double)((long)local_558 + 1);
    } while (local_558 != local_4a8);
    iVar19 = SUB84(local_4e0,0);
    if (iVar19 < 0x65) {
      if (iVar19 == 0) goto LAB_0095328e;
    }
    else {
      poVar3 = (ostringstream *)(local_438 + 8);
      local_438._0_8_ = local_550;
      std::__cxx11::ostringstream::ostringstream(poVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"(Skipped ",9);
      std::ostream::operator<<(poVar3,iVar19 + -100);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," messages.)",0xb);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar3);
      std::ios_base::~ios_base(local_3c0);
    }
    poVar3 = (ostringstream *)(local_438 + 8);
    local_438._0_8_ = local_550;
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::ostream::operator<<(poVar3,iVar19);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," inputs failed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    std::ios_base::~ios_base(local_3c0);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
    std::ostream::operator<<(local_438,iVar19);
    pTVar34 = local_4d8;
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
    std::ios_base::~ios_base(local_3c8);
    local_438._0_8_ = local_428;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_438," test failed. Check log for the details","");
    afVar29 = (float  [2])
              (CONCAT44(local_438._12_4_,local_438._8_4_) + (long)stack0xfffffffffffffac8);
    afVar30[0] = 2.10195e-44;
    afVar30[1] = 0.0;
    if ((IVal *)local_540._0_8_ != (IVal *)auStack_530) {
      afVar30 = (float  [2])auStack_530._0_8_;
    }
    if ((ulong)afVar30 < (ulong)afVar29) {
      afVar31[0] = 2.10195e-44;
      afVar31[1] = 0.0;
      if ((IVal *)local_438._0_8_ != (IVal *)local_428) {
        afVar31[1] = (float)local_428._4_4_;
        afVar31[0] = (float)local_428._0_4_;
      }
      if ((ulong)afVar31 < (ulong)afVar29) goto LAB_0095327f;
      puVar26 = (undefined8 *)
                std::__cxx11::string::replace((ulong)local_438,0,(char *)0x0,local_540._0_8_);
    }
    else {
LAB_0095327f:
      puVar26 = (undefined8 *)std::__cxx11::string::_M_append(local_540,local_438._0_8_);
    }
    local_1f8._0_8_ = local_1f8 + 0x10;
    pdVar1 = (double *)(puVar26 + 2);
    if ((double *)*puVar26 == pdVar1) {
      local_1f8._16_8_ = *pdVar1;
      local_1f8._24_4_ = *(undefined4 *)(puVar26 + 3);
      local_1f8._28_4_ = *(undefined4 *)((long)puVar26 + 0x1c);
    }
    else {
      local_1f8._16_8_ = *pdVar1;
      local_1f8._0_8_ = (double *)*puVar26;
    }
    local_1f8._8_8_ = puVar26[1];
    *puVar26 = pdVar1;
    puVar26[1] = 0;
    *(undefined1 *)pdVar1 = 0;
    pTVar34->m_code = QP_TEST_RESULT_FAIL;
    (pTVar34->m_description)._M_dataplus._M_p = (pointer)&(pTVar34->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar34->m_description,local_1f8._0_8_,
               (undefined1 *)(local_1f8._8_8_ + local_1f8._0_8_));
    if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
      operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
    }
    if ((IVal *)local_438._0_8_ != (IVal *)local_428) {
      operator_delete((void *)local_438._0_8_,CONCAT44(local_428._4_4_,local_428._0_4_) + 1);
    }
    afVar29 = (float  [2])auStack_530._0_8_;
    pIVar25 = (IVal *)local_540._0_8_;
    if ((IVal *)local_540._0_8_ == (IVal *)auStack_530) goto LAB_00953475;
  }
  operator_delete(pIVar25,(ulong)((long)afVar29 + 1));
LAB_00953475:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_message._M_dataplus._M_p != &local_80.m_message.field_2) {
    operator_delete(local_80.m_message._M_dataplus._M_p,
                    local_80.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_prefix._M_dataplus._M_p != &local_80.m_prefix.field_2) {
    operator_delete(local_80.m_prefix._M_dataplus._M_p,
                    local_80.m_prefix.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_498);
  if (local_468.out1.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_468.out1.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_468.out1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_468.out1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_468.out0.
      super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_468.out0.
                    super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_468.out0.
                          super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_468.out0.
                          super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in3.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in3.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in2.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in2.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in1.
      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in1.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in1.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in1.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in0.
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in0.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in0.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in0.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return pTVar34;
}

Assistant:

tcu::TestStatus BuiltinPrecisionCaseTestInstance<In, Out>::iterate (void)
{
	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	Inputs<In>			inputs		= generateInputs(m_samplings, m_caseCtx.floatFormat, m_caseCtx.precision, m_caseCtx.numRandoms, 0xdeadbeefu + m_caseCtx.testContext.getCommandLine().getBaseSeed());
	const FloatFormat&	fmt			= m_caseCtx.floatFormat;
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	const FloatFormat	highpFmt	= m_caseCtx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.
	ResultCollector		status;
	TestLog&			testLog		= m_context.getTestContext().getLog();

	const void*			inputArr[]	=
	{
		&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
	};
	void*				outputArr[]	=
	{
		&outputs.out0.front(), &outputs.out1.front(),
	};

	// Print out the statement and its definitions
	testLog << TestLog::Message << "Statement: " << m_stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		m_stmt->getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			testLog << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	m_executor->execute(int(numValues), inputArr, outputArr);

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*m_variables.in0, in0);
		env.bind(*m_variables.in1, in1);
		env.bind(*m_variables.in2, in2);
		env.bind(*m_variables.in3, in3);
		env.bind(*m_variables.out0, reference0);
		env.bind(*m_variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		env.lookup(*m_variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*m_variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*m_variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*m_variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_caseCtx.precision, env);
			m_stmt->execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*m_variables.out1));
				if (!status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*m_variables.out0));
				if (!status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= testLog.message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << m_variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << m_variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << m_variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << m_variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << m_variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << m_variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		testLog << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		testLog << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		testLog << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}

	if (numErrors)
		return tcu::TestStatus::fail(de::toString(numErrors) + string(" test failed. Check log for the details"));
	else
		return tcu::TestStatus::pass("Pass");

}